

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEBody.cpp
# Opt level: O2

bool __thiscall test_CEBody::test_GetCoordinates(test_CEBody *this)

{
  bool bVar1;
  undefined1 uVar2;
  double date;
  allocator local_95;
  undefined4 local_94;
  CEDate local_90;
  CESkyCoord test_coords;
  
  date = CEDate::CurrentJD();
  CEDate::CEDate(&local_90,date,JD);
  CEBody::GetCoordinates(&test_coords,&this->base_,&local_90);
  CEDate::~CEDate(&local_90);
  bVar1 = operator==(&test_coords,&(this->base_).super_CESkyCoord);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"test_GetCoordinates",&local_95);
  local_94 = 0x83;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_95);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CESkyCoord::~CESkyCoord(&test_coords);
  return (bool)uVar2;
}

Assistant:

bool test_CEBody::test_GetCoordinates(void)
{
    // Test getting the coordinates
    CESkyCoord test_coords = base_.GetCoordinates();
    
    // Test that the coordinates are equal
    test_bool(test_coords == base_, true, __func__, __LINE__);

    return pass();
}